

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qsqlrelationaltablemodel.cpp
# Opt level: O0

QSqlTableModel * __thiscall
QSqlRelationalTableModel::relationModel(QSqlRelationalTableModel *this,int column)

{
  long lVar1;
  bool bVar2;
  QSqlRelationalTableModelPrivate *pQVar3;
  qsizetype qVar4;
  QRelation *pQVar5;
  int in_ESI;
  long in_FS_OFFSET;
  QRelation *in_stack_00000018;
  QSqlRelationalTableModelPrivate *d;
  QSharedPointer<QRelation> relation;
  QSharedPointer<QRelation> *in_stack_ffffffffffffffa8;
  QRelation *in_stack_ffffffffffffffb0;
  QRelatedTableModel *local_20;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar3 = d_func((QSqlRelationalTableModel *)0x15b1e9);
  if (-1 < in_ESI) {
    qVar4 = QList<QSharedPointer<QRelation>_>::size(&pQVar3->relations);
    if (in_ESI < qVar4) {
      QList<QSharedPointer<QRelation>_>::at
                ((QList<QSharedPointer<QRelation>_> *)in_stack_ffffffffffffffb0,
                 (qsizetype)in_stack_ffffffffffffffa8);
      QSharedPointer<QRelation>::QSharedPointer
                ((QSharedPointer<QRelation> *)in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8);
      bVar2 = QSharedPointer<QRelation>::operator!((QSharedPointer<QRelation> *)0x15b270);
      if (bVar2) {
LAB_0015b28a:
        local_20 = (QRelatedTableModel *)0x0;
      }
      else {
        QSharedPointer<QRelation>::operator->((QSharedPointer<QRelation> *)0x15b27e);
        bVar2 = QRelation::isValid(in_stack_ffffffffffffffb0);
        if (!bVar2) goto LAB_0015b28a;
        pQVar5 = QSharedPointer<QRelation>::operator->((QSharedPointer<QRelation> *)0x15b2a7);
        if (pQVar5->model == (QRelatedTableModel *)0x0) {
          QSharedPointer<QRelation>::operator->((QSharedPointer<QRelation> *)0x15b2b8);
          QRelation::populateModel(in_stack_00000018);
        }
        pQVar5 = QSharedPointer<QRelation>::operator->((QSharedPointer<QRelation> *)0x15b2ca);
        local_20 = pQVar5->model;
      }
      QSharedPointer<QRelation>::~QSharedPointer((QSharedPointer<QRelation> *)0x15b2e5);
      goto LAB_0015b2e5;
    }
  }
  local_20 = (QRelatedTableModel *)0x0;
LAB_0015b2e5:
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return &local_20->super_QSqlTableModel;
  }
  __stack_chk_fail();
}

Assistant:

QSqlTableModel *QSqlRelationalTableModel::relationModel(int column) const
{
    Q_D(const QSqlRelationalTableModel);
    if (column < 0 || column >= d->relations.size())
        return nullptr;

    auto relation = d->relations.at(column);
    if (!relation || !relation->isValid())
        return nullptr;

    if (!relation->model)
        relation->populateModel();
    return relation->model;
}